

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdgen.c
# Opt level: O0

char * readpassphrase(char *filename)

{
  FILE *pFVar1;
  int iVar2;
  FILE *__stream;
  int *piVar3;
  char *pcVar4;
  size_t sVar5;
  char *local_28;
  char *line;
  FILE *fp;
  char *filename_local;
  
  __stream = fopen(filename,"r");
  pFVar1 = _stderr;
  if (__stream == (FILE *)0x0) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    fprintf(pFVar1,"puttygen: cannot open %s: %s\n",filename,pcVar4);
    filename_local = (char *)0x0;
  }
  else {
    local_28 = fgetline((FILE *)__stream);
    if (local_28 == (char *)0x0) {
      iVar2 = ferror(__stream);
      pFVar1 = _stderr;
      if (iVar2 == 0) {
        local_28 = dupstr("");
      }
      else {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        fprintf(pFVar1,"puttygen: error reading from %s: %s\n",filename,pcVar4);
      }
    }
    else {
      sVar5 = strcspn(local_28,"\r\n");
      local_28[sVar5] = '\0';
    }
    fclose(__stream);
    filename_local = local_28;
  }
  return filename_local;
}

Assistant:

static char *readpassphrase(const char *filename)
{
    FILE *fp;
    char *line;

    fp = fopen(filename, "r");
    if (!fp) {
        fprintf(stderr, "puttygen: cannot open %s: %s\n",
                filename, strerror(errno));
        return NULL;
    }
    line = fgetline(fp);
    if (line)
        line[strcspn(line, "\r\n")] = '\0';
    else if (ferror(fp))
        fprintf(stderr, "puttygen: error reading from %s: %s\n",
                filename, strerror(errno));
    else        /* empty file */
        line = dupstr("");
    fclose(fp);
    return line;
}